

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::impl::anon_unknown_0::xpath_ast_node::is_posinv_expr(xpath_ast_node *this)

{
  bool bVar1;
  xpath_ast_node *local_20;
  xpath_ast_node *n;
  xpath_ast_node *this_local;
  
  switch(this->_type) {
  case '\x10':
  case '\x11':
    this_local._7_1_ = true;
    break;
  case '\x12':
  case '\x13':
  case '\x14':
    this_local._7_1_ = true;
    break;
  case '\x15':
  case '\x16':
    this_local._7_1_ = false;
    break;
  default:
    if ((this->_left == (xpath_ast_node *)0x0) || (bVar1 = is_posinv_expr(this->_left), bVar1)) {
      for (local_20 = this->_right; local_20 != (xpath_ast_node *)0x0; local_20 = local_20->_next) {
        bVar1 = is_posinv_expr(local_20);
        if (!bVar1) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case '8':
  case '9':
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool is_posinv_expr() const
		{
			switch (_type)
			{
			case ast_func_position:
			case ast_func_last:
				return false;

			case ast_string_constant:
			case ast_number_constant:
			case ast_variable:
				return true;

			case ast_step:
			case ast_step_root:
				return true;

			case ast_predicate:
			case ast_filter:
				return true;

			default:
				if (_left && !_left->is_posinv_expr()) return false;

				for (xpath_ast_node* n = _right; n; n = n->_next)
					if (!n->is_posinv_expr()) return false;

				return true;
			}
		}